

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O0

string * __thiscall TCLAP::Arg::longID(Arg *this,string *valueId)

{
  bool bVar1;
  char cVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *id;
  char *in_stack_fffffffffffffdf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  undefined8 in_stack_fffffffffffffe10;
  char __c;
  undefined7 in_stack_fffffffffffffe18;
  char in_stack_fffffffffffffe1f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__a;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [39];
  allocator<char> local_f1;
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [54];
  allocator<char> local_1a;
  undefined1 local_19;
  
  __c = (char)((ulong)in_stack_fffffffffffffe10 >> 0x38);
  local_19 = 0;
  __s = &local_1a;
  __a = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe40,(char *)__s,(allocator<char> *)__a);
  std::allocator<char>::~allocator(&local_1a);
  bVar1 = std::operator!=(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  if (bVar1) {
    flagStartString_abi_cxx11_();
    std::operator+(in_RSI,in_RDI);
    std::__cxx11::string::operator+=((string *)__a,local_50);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string(local_70);
    if ((in_RSI[4].field_2._M_local_buf[0] & 1U) != 0) {
      in_stack_fffffffffffffe1f = delimiter();
      __c = (char)((ulong)&local_f1 >> 0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_RDI,CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),__c,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
                     (char *)in_stack_fffffffffffffe00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
                     in_stack_fffffffffffffe00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
                     (char *)in_stack_fffffffffffffe00);
      std::__cxx11::string::operator+=((string *)__a,local_90);
      std::__cxx11::string::~string(local_90);
      std::__cxx11::string::~string(local_b0);
      std::__cxx11::string::~string(local_d0);
      std::__cxx11::string::~string(local_f0);
      std::allocator<char>::~allocator(&local_f1);
    }
    std::__cxx11::string::operator+=((string *)__a,",  ");
  }
  nameStartString_abi_cxx11_();
  std::operator+(in_RSI,in_RDI);
  std::__cxx11::string::operator+=((string *)__a,local_118);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string(local_138);
  if ((in_RSI[4].field_2._M_local_buf[0] & 1U) != 0) {
    cVar2 = delimiter();
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xfffffffffffffe47;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_RDI,CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),__c,
               (allocator<char> *)CONCAT17(cVar2,in_stack_fffffffffffffe08));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(cVar2,in_stack_fffffffffffffe08),(char *)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(cVar2,in_stack_fffffffffffffe08),__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(cVar2,in_stack_fffffffffffffe08),(char *)__rhs);
    std::__cxx11::string::operator+=((string *)__a,local_158);
    std::__cxx11::string::~string(local_158);
    std::__cxx11::string::~string(local_178);
    std::__cxx11::string::~string(local_198);
    std::__cxx11::string::~string(local_1b8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe47);
  }
  return in_RDI;
}

Assistant:

inline std::string Arg::longID( const std::string& valueId ) const
{
	std::string id = "";

	if ( _flag != "" )
	{
		id += Arg::flagStartString() + _flag;

		if ( _valueRequired )
			id += std::string( 1, Arg::delimiter() ) + "<" + valueId + ">";

		id += ",  ";
	}

	id += Arg::nameStartString() + _name;

	if ( _valueRequired )
		id += std::string( 1, Arg::delimiter() ) + "<" + valueId + ">";

	return id;

}